

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chatserver.cpp
# Opt level: O1

void __thiscall ChatServer::incomingConnection(ChatServer *this,qintptr socketDescriptor)

{
  int *piVar1;
  ulong uVar2;
  char cVar3;
  ServerWorker *this_00;
  QThread *pQVar4;
  iterator iVar5;
  reference piVar6;
  undefined4 *puVar7;
  long lVar8;
  int *piVar9;
  int iVar10;
  int *piVar11;
  int *piVar12;
  QString local_80;
  QObject local_68 [8];
  code *local_60;
  ImplFn local_58;
  QObject local_50 [8];
  QObject local_48 [8];
  QObject local_40 [8];
  QObject local_38 [8];
  
  this_00 = (ServerWorker *)operator_new(0x38);
  ServerWorker::ServerWorker(this_00,(QObject *)0x0);
  cVar3 = (**(code **)(*(long *)this_00 + 0x60))(this_00,socketDescriptor);
  if (cVar3 != '\0') {
    iVar10 = (int)(this->m_availableThreads).d.size;
    if (iVar10 < this->m_idealThreadCount) {
      pQVar4 = (QThread *)operator_new(0x10);
      QThread::QThread(pQVar4,(QObject *)this);
      local_80.d.d = (Data *)pQVar4;
      QtPrivate::QPodArrayOps<QThread*>::emplace<QThread*&>
                ((QPodArrayOps<QThread*> *)&this->m_availableThreads,
                 (this->m_availableThreads).d.size,(QThread **)&local_80);
      local_80.d.d = (Data *)CONCAT44(local_80.d.d._4_4_,1);
      QtPrivate::QPodArrayOps<int>::emplace<int&>
                ((QPodArrayOps<int> *)&this->m_threadsLoad,(this->m_threadsLoad).d.size,
                 (int *)&local_80);
      iVar5 = QList<QThread_*>::end(&this->m_availableThreads);
      QThread::start(iVar5.i[-1],7);
    }
    else {
      piVar1 = (this->m_threadsLoad).d.ptr;
      uVar2 = (this->m_threadsLoad).d.size;
      piVar11 = piVar1;
      if (1 < uVar2) {
        lVar8 = uVar2 * 4 + -4;
        piVar12 = piVar1;
        piVar9 = piVar1;
        do {
          piVar9 = piVar9 + 1;
          piVar11 = piVar9;
          if (*piVar12 <= *piVar9) {
            piVar11 = piVar12;
          }
          lVar8 = lVar8 + -4;
          piVar12 = piVar11;
        } while (lVar8 != 0);
      }
      iVar10 = (int)((ulong)((long)piVar11 - (long)piVar1) >> 2);
      piVar6 = QList<int>::operator[](&this->m_threadsLoad,(long)iVar10);
      *piVar6 = *piVar6 + 1;
    }
    QObject::moveToThread((QThread *)this_00);
    pQVar4 = (this->m_availableThreads).d.ptr[iVar10];
    local_80.d.d = (Data *)QThread::finished;
    local_80.d.ptr = (char16_t *)0x0;
    local_60 = QObject::deleteLater;
    local_58 = (ImplFn)0x0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QSlotObject<void_(QObject::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = QObject::deleteLater;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_68,(void **)pQVar4,(QObject *)&local_80,(void **)this_00,
               (QSlotObjectBase *)&local_60,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_68);
    local_80.d.d = (Data *)ServerWorker::disconnectedFromClient;
    local_80.d.ptr = (char16_t *)0x0;
    puVar7 = (undefined4 *)operator_new(0x38);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::
         QFunctorSlotObject<std::_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*,_int))(ServerWorker_*,_int)>,_0,_QtPrivate::List<>,_void>
         ::impl;
    *(code **)(puVar7 + 4) = userDisconnected;
    *(undefined8 *)(puVar7 + 6) = 0;
    puVar7[8] = iVar10;
    *(ServerWorker **)(puVar7 + 10) = this_00;
    *(ChatServer **)(puVar7 + 0xc) = this;
    QObject::connectImpl
              (local_38,(void **)this_00,(QObject *)&local_80,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_38);
    local_80.d.d = (Data *)ServerWorker::error;
    local_80.d.ptr = (char16_t *)0x0;
    puVar7 = (undefined4 *)operator_new(0x30);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::
         QFunctorSlotObject<std::_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*))(ServerWorker_*)>,_0,_QtPrivate::List<>,_void>
         ::impl;
    *(code **)(puVar7 + 4) = userError;
    *(undefined8 *)(puVar7 + 6) = 0;
    *(ServerWorker **)(puVar7 + 8) = this_00;
    *(ChatServer **)(puVar7 + 10) = this;
    QObject::connectImpl
              (local_40,(void **)this_00,(QObject *)&local_80,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_40);
    local_80.d.d = (Data *)ServerWorker::jsonReceived;
    local_80.d.ptr = (char16_t *)0x0;
    puVar7 = (undefined4 *)operator_new(0x30);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::
         QFunctorSlotObject<std::_Bind<void_(ChatServer::*(ChatServer_*,_ServerWorker_*,_std::_Placeholder<1>))(ServerWorker_*,_const_QJsonObject_&)>,_1,_QtPrivate::List<const_QJsonObject_&>,_void>
         ::impl;
    *(code **)(puVar7 + 4) = jsonReceived;
    *(undefined8 *)(puVar7 + 6) = 0;
    *(ServerWorker **)(puVar7 + 8) = this_00;
    *(ChatServer **)(puVar7 + 10) = this;
    QObject::connectImpl
              (local_48,(void **)this_00,(QObject *)&local_80,(void **)this,(QSlotObjectBase *)0x0,
               (ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_48);
    local_80.d.d = (Data *)stopAllClients;
    local_80.d.ptr = (char16_t *)0x0;
    local_60 = ServerWorker::disconnectFromClient;
    local_58 = (ImplFn)0x0;
    puVar7 = (undefined4 *)operator_new(0x20);
    *puVar7 = 1;
    *(code **)(puVar7 + 2) =
         QtPrivate::QSlotObject<void_(ServerWorker::*)(),_QtPrivate::List<>,_void>::impl;
    *(code **)(puVar7 + 4) = ServerWorker::disconnectFromClient;
    *(undefined8 *)(puVar7 + 6) = 0;
    QObject::connectImpl
              (local_50,(void **)this,(QObject *)&local_80,(void **)this_00,
               (QSlotObjectBase *)&local_60,(ConnectionType)puVar7,(int *)0x0,(QMetaObject *)0x0);
    QMetaObject::Connection::~Connection((Connection *)local_50);
    local_80.d.d = (Data *)this_00;
    QtPrivate::QPodArrayOps<ServerWorker*>::emplace<ServerWorker*&>
              ((QPodArrayOps<ServerWorker*> *)&this->m_clients,(this->m_clients).d.size,
               (ServerWorker **)&local_80);
    local_80.d.d = (Data *)0x0;
    local_80.d.ptr = L"New client Connected";
    local_80.d.size = 0x14;
    logMessage(this,&local_80);
    if (&(local_80.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_80.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_80.d.d)->super_QArrayData,2,8);
      }
    }
    return;
  }
  QObject::deleteLater();
  return;
}

Assistant:

void ChatServer::incomingConnection(qintptr socketDescriptor)
{
    ServerWorker *worker = new ServerWorker;
    if (!worker->setSocketDescriptor(socketDescriptor)) {
        worker->deleteLater();
        return;
    }
    int threadIdx = m_availableThreads.size();
    if (threadIdx < m_idealThreadCount) { //we can add a new thread
        m_availableThreads.append(new QThread(this));
        m_threadsLoad.append(1);
        m_availableThreads.last()->start();
    } else {
        // find the thread with the least amount of clients and use it
        threadIdx = std::distance(m_threadsLoad.cbegin(), std::min_element(m_threadsLoad.cbegin(), m_threadsLoad.cend()));
        ++m_threadsLoad[threadIdx];
    }
    worker->moveToThread(m_availableThreads.at(threadIdx));
    connect(m_availableThreads.at(threadIdx), &QThread::finished, worker, &QObject::deleteLater);
    connect(worker, &ServerWorker::disconnectedFromClient, this, std::bind(&ChatServer::userDisconnected, this, worker, threadIdx));
    connect(worker, &ServerWorker::error, this, std::bind(&ChatServer::userError, this, worker));
    connect(worker, &ServerWorker::jsonReceived, this, std::bind(&ChatServer::jsonReceived, this, worker, std::placeholders::_1));
    connect(this, &ChatServer::stopAllClients, worker, &ServerWorker::disconnectFromClient);
    m_clients.append(worker);
    emit logMessage(QStringLiteral("New client Connected"));
}